

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenFieldNames(CppGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  reference ppFVar2;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_160;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_158;
  allocator<char> local_149;
  string local_148;
  string local_128;
  allocator<char> local_101;
  string local_100;
  FieldDef *local_e0;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_d0;
  const_iterator it;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"  static constexpr std::array<\\",&local_39);
  CodeWriter::operator+=(&this->code_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"const char *, fields_number> field_names = {\\",&local_71);
  CodeWriter::operator+=(&this->code_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::empty
                    (&(local_18->fields).vec);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"};",&local_99);
    CodeWriter::operator+=(&this->code_,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"",(allocator<char> *)((long)&it._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    local_d0._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(local_18->fields).vec);
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(local_18->fields).vec);
      bVar1 = __gnu_cxx::operator!=
                        (&local_d0,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar1) break;
      ppFVar2 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_d0);
      local_e0 = *ppFVar2;
      if ((local_e0->deprecated & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"FIELD_NAME",&local_101);
        Name_abi_cxx11_(&local_128,this,local_e0);
        CodeWriter::SetValue(&this->code_,&local_100,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator(&local_101);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"    \"{{FIELD_NAME}}\"\\",&local_149);
        CodeWriter::operator+=(&this->code_,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        local_158 = __gnu_cxx::
                    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                    ::operator+(&local_d0,1);
        local_160._M_current =
             (FieldDef **)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                       (&(local_18->fields).vec);
        bVar1 = __gnu_cxx::operator!=(&local_158,&local_160);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,",",&local_181);
          CodeWriter::operator+=(&this->code_,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator(&local_181);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_d0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"\n  };",&local_1a9);
    CodeWriter::operator+=(&this->code_,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  return;
}

Assistant:

void GenFieldNames(const StructDef &struct_def) {
    code_ += "  static constexpr std::array<\\";
    code_ += "const char *, fields_number> field_names = {\\";
    if (struct_def.fields.vec.empty()) {
      code_ += "};";
      return;
    }
    code_ += "";
    // Generate the field_names elements.
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }
      code_.SetValue("FIELD_NAME", Name(field));
      code_ += R"(    "{{FIELD_NAME}}"\)";
      if (it + 1 != struct_def.fields.vec.end()) { code_ += ","; }
    }
    code_ += "\n  };";
  }